

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHybridizeHDiv.cpp
# Opt level: O3

tuple<long,_int> __thiscall
TPZHybridizeHDiv::SplitConnects
          (TPZHybridizeHDiv *this,TPZCompElSide *left,TPZCompElSide *right,
          TPZVec<TPZCompMesh_*> *meshvec_Hybrid)

{
  byte bVar1;
  uchar uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  TPZCompEl *this_00;
  TPZCompEl *this_01;
  long lVar6;
  TPZConnect *pTVar7;
  TPZGeoEl *pTVar8;
  TPZCompEl *this_02;
  long *plVar9;
  TPZCompEl *this_03;
  long extraout_RDX;
  long extraout_RDX_00;
  _Head_base<0UL,_long,_false> _Var10;
  uint uVar11;
  long in_R8;
  tuple<long,_int> tVar12;
  TPZGeoElBC gbc;
  TPZGeoElSide gright;
  TPZGeoElSide gleft;
  TPZStack<TPZCompElSide,_10> equalright;
  TPZGeoElBC local_158;
  uint local_14c;
  TPZCompElSide *local_148;
  TPZCompMesh *local_140;
  TPZVec<TPZCompMesh_*> *local_138;
  TPZHybridizeHDiv *local_130;
  TPZCreateApproximationSpace *local_128;
  TPZGeoElSide local_120;
  TPZGeoElSide local_108;
  TPZStack<TPZCompElSide,_10> local_f0;
  
  local_148 = left;
  if ((*(int *)&left->fEl == 0) || (*(int *)((long)&left->fEl + 4) == 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Using uninitialized TPZHybridizeHDiv object. You need to call ComputePeriferalMaterialIds function first!"
               ,0x69);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZHybridizeHDiv.cpp"
               ,0x51);
  }
  local_140 = (TPZCompMesh *)**(long **)(in_R8 + 8);
  TPZCompElSide::Reference(&local_108,right);
  TPZCompElSide::Reference(&local_120,(TPZCompElSide *)meshvec_Hybrid);
  if (right->fEl == (TPZCompEl *)0x0) {
    this_00 = (TPZCompEl *)0x0;
  }
  else {
    this_00 = (TPZCompEl *)
              __dynamic_cast(right->fEl,&TPZCompEl::typeinfo,&TPZInterpolatedElement::typeinfo,0);
  }
  if (meshvec_Hybrid->_vptr_TPZVec == (_func_int **)0x0) {
    this_01 = (TPZCompEl *)0x0;
  }
  else {
    this_01 = (TPZCompEl *)
              __dynamic_cast(meshvec_Hybrid->_vptr_TPZVec,&TPZCompEl::typeinfo,
                             &TPZInterpolatedElement::typeinfo,0);
  }
  (**(code **)(*(long *)this_00 + 0x2f8))(this_00,right->fSide,1);
  local_138 = meshvec_Hybrid;
  (**(code **)(*(long *)this_01 + 0x2f8))(this_01,*(undefined4 *)&meshvec_Hybrid->fStore,1);
  lVar6 = 0x28;
  do {
    *(undefined8 *)((long)local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc + lVar6 + -0x28)
         = 0;
    *(undefined4 *)
     ((long)&(((TPZManVector<TPZCompElSide,_10> *)
              (local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc + -2))->
             super_TPZVec<TPZCompElSide>)._vptr_TPZVec + lVar6) = 0xffffffff;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 200);
  local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore =
       local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc;
  local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements = 0;
  local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNAlloc = 0;
  local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0181a690;
  pTVar7 = TPZInterpolatedElement::SideConnect((TPZInterpolatedElement *)this_00,0,right->fSide);
  if (pTVar7->fDependList == (TPZDepend *)0x0) {
    TPZCompElSide::SplitConnect(right,(TPZCompElSide *)local_138);
  }
  else {
    TPZGeoElSide::EqualLevelCompElementList(&local_120,&local_f0,1,0);
    if (local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements != 0)
    {
      pTVar8 = TPZCompEl::Reference
                         ((local_f0.super_TPZManVector<TPZCompElSide,_10>.
                           super_TPZVec<TPZCompElSide>.fStore)->fEl);
      pTVar8->fReference = (TPZCompEl *)0x0;
    }
    TPZConnect::RemoveDepend(pTVar7);
  }
  bVar1 = (pTVar7->field_2).fCompose.fOrder;
  uVar11 = (uint)bVar1;
  local_140->fDefaultOrder = (uint)bVar1;
  pTVar8 = TPZCompEl::Reference(this_01);
  pTVar8->fReference = (TPZCompEl *)0x0;
  (**(code **)(*(long *)this_00 + 0x68))(this_00);
  (**(code **)(*(long *)this_00 + 0x2d8))(this_00,(uint)bVar1);
  TPZGeoElBC::TPZGeoElBC(&local_158,&local_108,*(int *)&local_148->fEl);
  local_128 = &local_140->fCreate;
  this_02 = TPZCreateApproximationSpace::CreateCompEl(local_128,local_158.fCreatedElement,local_140)
  ;
  if ((pTVar7->field_2).fCompose.fOrder != bVar1) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZHybridizeHDiv.cpp"
               ,0x85);
  }
  if (this_02 == (TPZCompEl *)0x0) {
    plVar9 = (long *)0x0;
  }
  else {
    plVar9 = (long *)__dynamic_cast(this_02,&TPZCompEl::typeinfo,&TPZInterpolatedElement::typeinfo,0
                                   );
  }
  iVar5 = (**(code **)(*(long *)local_158.fCreatedElement + 0xf0))();
  (**(code **)(*plVar9 + 0x2f8))(plVar9,iVar5 + -1,1);
  pTVar8 = TPZCompEl::Reference(this_00);
  pTVar8->fReference = (TPZCompEl *)0x0;
  pTVar8 = TPZCompEl::Reference(this_02);
  pTVar8->fReference = (TPZCompEl *)0x0;
  if (local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements == 0) {
    pTVar8 = TPZCompEl::Reference(this_00);
    pTVar8->fReference = (TPZCompEl *)0x0;
    (**(code **)(*(long *)this_01 + 0x68))(this_01);
    local_14c = (uint)bVar1;
    local_130 = this;
    pTVar7 = TPZInterpolatedElement::SideConnect
                       ((TPZInterpolatedElement *)this_01,0,*(int *)&local_138->fStore);
    uVar2 = (pTVar7->field_2).fCompose.fOrder;
    (**(code **)(*(long *)this_01 + 0x2d8))(this_01,uVar2);
    TPZGeoElBC::TPZGeoElBC(&local_158,&local_120,*(int *)&local_148->fEl);
    this_03 = TPZCreateApproximationSpace::CreateCompEl
                        (local_128,local_158.fCreatedElement,local_140);
    if ((pTVar7->field_2).fCompose.fOrder != uVar2) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZHybridizeHDiv.cpp"
                 ,0x99);
    }
    if (this_03 == (TPZCompEl *)0x0) {
      plVar9 = (long *)0x0;
    }
    else {
      plVar9 = (long *)__dynamic_cast(this_03,&TPZCompEl::typeinfo,&TPZInterpolatedElement::typeinfo
                                      ,0);
    }
    uVar11 = local_14c;
    iVar5 = (**(code **)(*(long *)local_158.fCreatedElement + 0xf0))();
    (**(code **)(*plVar9 + 0x2f8))(plVar9,iVar5 + -1,1);
    pTVar8 = TPZCompEl::Reference(this_01);
    pTVar8->fReference = (TPZCompEl *)0x0;
    pTVar8 = TPZCompEl::Reference(this_03);
    pTVar8->fReference = (TPZCompEl *)0x0;
    this = local_130;
  }
  else {
    this_03 = (local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore)->
              fEl;
  }
  (**(code **)(*(long *)this_02 + 0x68))(this_02);
  (**(code **)(*(long *)this_03 + 0x68))(this_03);
  TPZGeoElBC::TPZGeoElBC(&local_158,&local_108,*(int *)((long)&local_148->fEl + 4));
  uVar3 = *(undefined4 *)&(local_158.fCreatedElement)->fIndex;
  uVar4 = *(undefined4 *)((long)&(local_158.fCreatedElement)->fIndex + 4);
  (**(code **)(*(long *)this_00 + 0x68))(this_00);
  (**(code **)(*(long *)this_01 + 0x68))(this_01);
  this->fHDivWrapMatid = uVar11;
  this->fLagrangeInterfaceEnd = uVar3;
  (this->fInterfaceMatid).first = uVar4;
  _Var10._M_head_impl = extraout_RDX;
  if (local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore !=
      local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc) {
    local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNAlloc = 0;
    local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
         (_func_int **)&PTR__TPZVec_018142b0;
    if (local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore !=
        (TPZCompElSide *)0x0) {
      operator_delete__(local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                        fStore);
      _Var10._M_head_impl = extraout_RDX_00;
    }
  }
  tVar12.super__Tuple_impl<0UL,_long,_int>.super__Head_base<0UL,_long,_false>._M_head_impl =
       _Var10._M_head_impl;
  tVar12.super__Tuple_impl<0UL,_long,_int>._0_8_ = this;
  return (tuple<long,_int>)tVar12.super__Tuple_impl<0UL,_long,_int>;
}

Assistant:

std::tuple<int64_t, int> TPZHybridizeHDiv::SplitConnects(const TPZCompElSide &left, const TPZCompElSide &right, TPZVec<TPZCompMesh *> &meshvec_Hybrid) {
    if (fHDivWrapMatid == 0 || fLagrangeInterface == 0) {
        std::cerr << "Using uninitialized TPZHybridizeHDiv object. You need to call ComputePeriferalMaterialIds function first!" << std::endl;
        DebugStop();
    }
    TPZCompMesh *fluxmesh = meshvec_Hybrid[0];
    //TPZCompMesh *pressuremesh = meshvec[1];
    //TPZGeoMesh *gmesh = fluxmesh->Reference();
    TPZGeoElSide gleft(left.Reference());
    TPZGeoElSide gright(right.Reference());
    TPZInterpolatedElement *intelleft = dynamic_cast<TPZInterpolatedElement *> (left.Element());
    TPZInterpolatedElement *intelright = dynamic_cast<TPZInterpolatedElement *> (right.Element());
    intelleft->SetSideOrient(left.Side(), 1);
    intelright->SetSideOrient(right.Side(), 1);
    TPZStack<TPZCompElSide> equalright;
    TPZConnect &cleft = intelleft->SideConnect(0, left.Side());

    if (cleft.HasDependency()) {
        // check whether the wrap of the large element was already created
        gright.EqualLevelCompElementList(equalright,1,0);
        // only one wrap element should exist
#ifdef PZDEBUG
        if(equalright.size() > 1)
        {
            DebugStop();
        }
        if(equalright.size()==1)
        {
            TPZGeoEl *equalgel = equalright[0].Element()->Reference();
            if(equalgel->Dimension() != fluxmesh->Dimension()-1)
            {
                DebugStop();
            }
        }
#endif
        // reset the reference of the wrap element
        if(equalright.size()) equalright[0].Element()->Reference()->ResetReference();
        cleft.RemoveDepend();
    }
    else
    {
        left.SplitConnect(right);
    }
    int sideorder = cleft.Order();
    fluxmesh->SetDefaultOrder(sideorder);
    // create HDivBound on the sides of the elements
    TPZCompEl *wrap1, *wrap2;
    {
        intelright->Reference()->ResetReference();
        intelleft->LoadElementReference();
        intelleft->SetPreferredOrder(sideorder);
        TPZGeoElBC gbc(gleft, fHDivWrapMatid);
        wrap1 = fluxmesh->ApproxSpace().CreateCompEl(gbc.CreatedElement(), *fluxmesh);
        if(cleft.Order() != sideorder)
        {
            DebugStop();
        }
        TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *> (wrap1);
        int wrapside = gbc.CreatedElement()->NSides() - 1;
        intel->SetSideOrient(wrapside, 1);
        intelleft->Reference()->ResetReference();
        wrap1->Reference()->ResetReference();
    }
    // if the wrap of the large element was not created...
    if(equalright.size() == 0)
    {
        intelleft->Reference()->ResetReference();
        intelright->LoadElementReference();
        TPZConnect &cright = intelright->SideConnect(0,right.Side());
        int rightprevorder = cright.Order();
        intelright->SetPreferredOrder(cright.Order());
        TPZGeoElBC gbc(gright, fHDivWrapMatid);
        wrap2 = fluxmesh->ApproxSpace().CreateCompEl(gbc.CreatedElement(), *fluxmesh);
        if(cright.Order() != rightprevorder)
        {
            DebugStop();
        }
        TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *> (wrap2);
        int wrapside = gbc.CreatedElement()->NSides() - 1;
        intel->SetSideOrient(wrapside, 1);
        intelright->Reference()->ResetReference();
        wrap2->Reference()->ResetReference();
    }
    else
    {
        wrap2 = equalright[0].Element();
    }
    wrap1->LoadElementReference();
    wrap2->LoadElementReference();
    int64_t pressureindex;
    int lagmatid = fLagrangeInterface;
    int pressureorder;
    {
        TPZGeoElBC gbc(gleft, lagmatid);
        pressureindex = gbc.CreatedElement()->Index();
        pressureorder = sideorder;
    }
    intelleft->LoadElementReference();
    intelright->LoadElementReference();
    return std::make_tuple(pressureindex, pressureorder);
}